

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_Surface::IsTorus(ON_Surface *this,ON_Torus *torus,double tolerance)

{
  double dVar1;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint test_point;
  ON_3dPoint test_point_00;
  ON_3dPoint test_point_01;
  ON_3dPoint test_point_02;
  ON_3dPoint test_point_03;
  ON_3dPoint test_point_04;
  bool bVar2;
  byte bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool local_661;
  undefined4 local_5d8;
  undefined4 local_598;
  bool rc;
  ON_3dPoint local_560;
  double local_548;
  double dStack_540;
  double local_538;
  ON_3dPoint local_530;
  ON_3dPoint local_518;
  uint local_500;
  int local_4fc;
  int jj;
  int j;
  int ii;
  int i;
  double *t;
  double *s;
  int sc1;
  int sc0;
  double v;
  double u;
  double dStack_4c0;
  double local_4b8;
  ON_3dPoint local_4b0;
  double local_498;
  double dStack_490;
  double local_488;
  ON_3dPoint local_478;
  ON_3dPoint local_460;
  double local_448;
  double dStack_440;
  double local_438;
  ON_3dPoint local_430;
  double local_418;
  double dStack_410;
  double local_408;
  ON_3dPoint local_3f8;
  ON_3dPoint local_3e0;
  double local_3c8;
  double d;
  double a;
  ON_3dPoint T;
  undefined1 auStack_398 [8];
  ON_3dPoint P;
  double tr1tol;
  double tr0tol;
  undefined1 local_368 [6];
  bool bTestTorus1;
  bool bTestTorus0;
  ON_3dPoint local_350;
  double local_338;
  double dStack_330;
  double local_328;
  undefined1 auStack_318 [8];
  ON_Torus tr1;
  ON_3dPoint local_270;
  double local_258;
  double dStack_250;
  double local_248;
  double local_240;
  double h;
  ON_Torus tr0;
  double tol;
  undefined1 auStack_198 [4];
  int bIsArc1;
  ON_Arc arc1;
  undefined1 auStack_d8 [4];
  int bIsArc0;
  ON_Arc arc0;
  ON_Curve *crv;
  double tolerance_local;
  ON_Torus *torus_local;
  ON_Surface *this_local;
  long *plVar5;
  
  bVar2 = ON_IsValid(tolerance);
  if ((!bVar2) || (crv = (ON_Curve *)tolerance, tolerance <= 0.0)) {
    crv = (ON_Curve *)0x3df0000000000000;
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  dVar1 = ON_Interval::Mid((ON_Interval *)(arc0.m_angle.m_t + 1));
  iVar4 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(SUB84(dVar1,0),this,0);
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  if (plVar5 == (long *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ON_Arc::ON_Arc((ON_Arc *)auStack_d8);
    local_598 = SUB84(crv,0);
    local_5d8 = local_598;
    if ((double)crv <= 2.3283064365386963e-10) {
      local_598 = 0;
    }
    bVar3 = (**(code **)(*plVar5 + 0x180))(local_598,plVar5,0,auStack_d8);
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x20))();
    }
    if ((bVar3 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
      dVar1 = ON_Interval::Mid((ON_Interval *)(arc1.m_angle.m_t + 1));
      iVar4 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])
                        (SUB84(dVar1,0),this,1);
      plVar5 = (long *)CONCAT44(extraout_var_00,iVar4);
      if (plVar5 == (long *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        ON_Arc::ON_Arc((ON_Arc *)auStack_198);
        if ((double)crv <= 2.3283064365386963e-10) {
          local_5d8 = 0;
        }
        bVar3 = (**(code **)(*plVar5 + 0x180))(local_5d8,plVar5,0,auStack_198);
        if (plVar5 != (long *)0x0) {
          (**(code **)(*plVar5 + 0x20))();
        }
        if ((bVar3 & 1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          tr0.minor_radius =
               (arc0.super_ON_Circle.plane.plane_equation.d +
               arc1.super_ON_Circle.plane.plane_equation.d) * 7.450580596925e-09;
          ON_Torus::ON_Torus((ON_Torus *)&h);
          tr0.plane.plane_equation.y = arc0.super_ON_Circle.plane.plane_equation.y;
          tr0.plane.plane_equation.z = arc0.super_ON_Circle.plane.plane_equation.z;
          tr0.plane.zaxis.z = arc0.super_ON_Circle.plane.zaxis.z;
          tr0.plane.plane_equation.x = arc0.super_ON_Circle.plane.plane_equation.x;
          tr0.plane.zaxis.x = arc0.super_ON_Circle.plane.zaxis.x;
          tr0.plane.zaxis.y = arc0.super_ON_Circle.plane.zaxis.y;
          tr0.plane.yaxis.y = arc0.super_ON_Circle.plane.yaxis.y;
          tr0.plane.yaxis.z = arc0.super_ON_Circle.plane.yaxis.z;
          tr0.plane.xaxis.z = arc0.super_ON_Circle.plane.xaxis.z;
          tr0.plane.yaxis.x = arc0.super_ON_Circle.plane.yaxis.x;
          tr0.plane.xaxis.x = arc0.super_ON_Circle.plane.xaxis.x;
          tr0.plane.xaxis.y = arc0.super_ON_Circle.plane.xaxis.y;
          tr0.plane.origin.y = arc0.super_ON_Circle.plane.origin.y;
          tr0.plane.origin.z = arc0.super_ON_Circle.plane.origin.z;
          h = _auStack_d8;
          tr0.plane.origin.x = arc0.super_ON_Circle.plane.origin.x;
          local_248 = arc1.super_ON_Circle.plane.origin.y;
          local_258 = _auStack_198;
          dStack_250 = arc1.super_ON_Circle.plane.origin.x;
          P_00.y = arc1.super_ON_Circle.plane.origin.x;
          P_00.x = _auStack_198;
          P_00.z = arc1.super_ON_Circle.plane.origin.y;
          local_240 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)&tr0.plane.zaxis.z,P_00);
          ::operator*((ON_3dVector *)&tr1.minor_radius,local_240,(ON_3dVector *)&tr0.plane.yaxis.z);
          ON_3dPoint::operator+(&local_270,(ON_3dPoint *)&h,(ON_3dVector *)&tr1.minor_radius);
          tr0.plane.origin.y = local_270.z;
          h = local_270.x;
          tr0.plane.origin.x = local_270.y;
          ON_Plane::UpdateEquation((ON_Plane *)&h);
          tr0.plane.plane_equation.d =
               ON_3dPoint::DistanceTo((ON_3dPoint *)&h,(ON_3dPoint *)auStack_198);
          tr0.major_radius = arc1.super_ON_Circle.plane.plane_equation.d;
          ON_Torus::ON_Torus((ON_Torus *)auStack_318);
          tr1.plane.plane_equation.y = arc1.super_ON_Circle.plane.plane_equation.y;
          tr1.plane.plane_equation.z = arc1.super_ON_Circle.plane.plane_equation.z;
          tr1.plane.zaxis.z = arc1.super_ON_Circle.plane.zaxis.z;
          tr1.plane.plane_equation.x = arc1.super_ON_Circle.plane.plane_equation.x;
          tr1.plane.zaxis.x = arc1.super_ON_Circle.plane.zaxis.x;
          tr1.plane.zaxis.y = arc1.super_ON_Circle.plane.zaxis.y;
          tr1.plane.yaxis.y = arc1.super_ON_Circle.plane.yaxis.y;
          tr1.plane.yaxis.z = arc1.super_ON_Circle.plane.yaxis.z;
          tr1.plane.xaxis.z = arc1.super_ON_Circle.plane.xaxis.z;
          tr1.plane.yaxis.x = arc1.super_ON_Circle.plane.yaxis.x;
          tr1.plane.xaxis.x = arc1.super_ON_Circle.plane.xaxis.x;
          tr1.plane.xaxis.y = arc1.super_ON_Circle.plane.xaxis.y;
          tr1.plane.origin.y = arc1.super_ON_Circle.plane.origin.y;
          tr1.plane.origin.z = arc1.super_ON_Circle.plane.origin.z;
          auStack_318 = (undefined1  [8])_auStack_198;
          tr1.plane.origin.x = arc1.super_ON_Circle.plane.origin.x;
          local_328 = arc0.super_ON_Circle.plane.origin.y;
          local_338 = _auStack_d8;
          dStack_330 = arc0.super_ON_Circle.plane.origin.x;
          P_01.y = arc0.super_ON_Circle.plane.origin.x;
          P_01.x = _auStack_d8;
          P_01.z = arc0.super_ON_Circle.plane.origin.y;
          local_240 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)&tr1.plane.zaxis.z,P_01);
          ::operator*((ON_3dVector *)local_368,local_240,(ON_3dVector *)&tr1.plane.yaxis.z);
          ON_3dPoint::operator+(&local_350,(ON_3dPoint *)auStack_318,(ON_3dVector *)local_368);
          tr1.plane.origin.y = local_350.z;
          auStack_318 = (undefined1  [8])local_350.x;
          tr1.plane.origin.x = local_350.y;
          ON_Plane::UpdateEquation((ON_Plane *)auStack_318);
          tr1.plane.plane_equation.d =
               ON_3dPoint::DistanceTo((ON_3dPoint *)auStack_318,(ON_3dPoint *)auStack_d8);
          tr1.major_radius = arc0.super_ON_Circle.plane.plane_equation.d;
          tr0tol._7_1_ = ON_Torus::IsValid((ON_Torus *)&h,(ON_TextLog *)0x0);
          bVar2 = ON_Torus::IsValid((ON_Torus *)auStack_318,(ON_TextLog *)0x0);
          tr0tol._6_1_ = (bool)(-bVar2 & 1);
          if ((tr0tol._7_1_) || (tr0tol._6_1_ != false)) {
            tr1tol = 0.0;
            P.z = 0.0;
            for (d = 0.0; d < 1.0; d = d + 0.25) {
              ON_Circle::PointAt(&local_3e0,(ON_Circle *)auStack_d8,(d + d) * 3.141592653589793);
              auStack_398 = (undefined1  [8])local_3e0.x;
              P.x = local_3e0.y;
              P.y = local_3e0.z;
              if (tr0tol._7_1_ != false) {
                local_408 = local_3e0.z;
                local_418 = local_3e0.x;
                dStack_410 = local_3e0.y;
                test_point.y = local_3e0.y;
                test_point.x = local_3e0.x;
                test_point.z = local_3e0.z;
                ON_Torus::ClosestPointTo(&local_3f8,(ON_Torus *)&h,test_point);
                T.y = local_3f8.z;
                a = local_3f8.x;
                T.x = local_3f8.y;
                local_3c8 = ON_3dPoint::DistanceTo((ON_3dPoint *)&a,(ON_3dPoint *)auStack_398);
                if (local_3c8 <= tr0.minor_radius) {
                  if (tr1tol < local_3c8) {
                    tr1tol = local_3c8;
                  }
                }
                else {
                  tr0tol._7_1_ = false;
                  if (tr0tol._6_1_ == false) {
                    this_local._7_1_ = false;
                    goto LAB_0082b937;
                  }
                }
              }
              if (tr0tol._6_1_ != false) {
                local_438 = P.y;
                local_448 = (double)auStack_398;
                dStack_440 = P.x;
                test_point_00.y = P.x;
                test_point_00.x = (double)auStack_398;
                test_point_00.z = P.y;
                ON_Torus::ClosestPointTo(&local_430,(ON_Torus *)auStack_318,test_point_00);
                T.y = local_430.z;
                a = local_430.x;
                T.x = local_430.y;
                local_3c8 = ON_3dPoint::DistanceTo((ON_3dPoint *)&a,(ON_3dPoint *)auStack_398);
                if (local_3c8 <= tr0.minor_radius) {
                  if (P.z < local_3c8) {
                    P.z = local_3c8;
                  }
                }
                else {
                  tr0tol._6_1_ = false;
                  if (tr0tol._7_1_ == false) {
                    this_local._7_1_ = false;
                    goto LAB_0082b937;
                  }
                }
              }
              ON_Circle::PointAt(&local_460,(ON_Circle *)auStack_198,(d + d) * 3.141592653589793);
              auStack_398 = (undefined1  [8])local_460.x;
              P.x = local_460.y;
              P.y = local_460.z;
              if (tr0tol._7_1_ != false) {
                local_488 = local_460.z;
                local_498 = local_460.x;
                dStack_490 = local_460.y;
                test_point_01.y = local_460.y;
                test_point_01.x = local_460.x;
                test_point_01.z = local_460.z;
                ON_Torus::ClosestPointTo(&local_478,(ON_Torus *)&h,test_point_01);
                T.y = local_478.z;
                a = local_478.x;
                T.x = local_478.y;
                local_3c8 = ON_3dPoint::DistanceTo((ON_3dPoint *)&a,(ON_3dPoint *)auStack_398);
                if (local_3c8 <= tr0.minor_radius) {
                  if (tr1tol < local_3c8) {
                    tr1tol = local_3c8;
                  }
                }
                else {
                  tr0tol._7_1_ = false;
                  if (tr0tol._6_1_ == false) {
                    this_local._7_1_ = false;
                    goto LAB_0082b937;
                  }
                }
              }
              if (tr0tol._6_1_ != false) {
                local_4b8 = P.y;
                u = (double)auStack_398;
                dStack_4c0 = P.x;
                test_point_02.y = P.x;
                test_point_02.x = (double)auStack_398;
                test_point_02.z = P.y;
                ON_Torus::ClosestPointTo(&local_4b0,(ON_Torus *)auStack_318,test_point_02);
                T.y = local_4b0.z;
                a = local_4b0.x;
                T.x = local_4b0.y;
                local_3c8 = ON_3dPoint::DistanceTo((ON_3dPoint *)&a,(ON_3dPoint *)auStack_398);
                if (local_3c8 <= tr0.minor_radius) {
                  if (P.z < local_3c8) {
                    P.z = local_3c8;
                  }
                }
                else {
                  tr0tol._6_1_ = false;
                  if (tr0tol._7_1_ == false) {
                    this_local._7_1_ = false;
                    goto LAB_0082b937;
                  }
                }
              }
            }
            if ((tr0tol._7_1_ == false) && (tr0tol._6_1_ == false)) {
              this_local._7_1_ = false;
            }
            else {
              if (tr0.minor_radius < (double)crv) {
                tr0.minor_radius = (double)crv;
              }
              s._4_4_ = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0);
              s._0_4_ = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1);
              t = (double *)onmalloc((long)(s._4_4_ + (int)s) * 8 + 0x10);
              _ii = t + (long)s._4_4_ + 1;
              (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,t);
              (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1,_ii);
              for (j = 0; j < s._4_4_; j = j + 1) {
                for (jj = (int)(j != 0); jj < 5; jj = jj + 1) {
                  v = ((double)(4 - jj) * t[j] + (double)jj * t[j + 1]) * 0.25;
                  for (local_4fc = 0; local_4fc < (int)s; local_4fc = local_4fc + 1) {
                    for (local_500 = (uint)(local_4fc != 0); (int)local_500 < 5;
                        local_500 = local_500 + 1) {
                      _sc1 = ((double)(int)(4 - local_500) * _ii[local_4fc] +
                             (double)(int)local_500 * _ii[(long)local_4fc + 1]) * 0.25;
                      PointAt(&local_518,this,v,_sc1);
                      auStack_398 = (undefined1  [8])local_518.x;
                      P.x = local_518.y;
                      P.y = local_518.z;
                      if (tr0tol._7_1_ != false) {
                        local_538 = local_518.z;
                        local_548 = local_518.x;
                        dStack_540 = local_518.y;
                        test_point_03.y = local_518.y;
                        test_point_03.x = local_518.x;
                        test_point_03.z = local_518.z;
                        ON_Torus::ClosestPointTo(&local_530,(ON_Torus *)&h,test_point_03);
                        T.y = local_530.z;
                        a = local_530.x;
                        T.x = local_530.y;
                        local_3c8 = ON_3dPoint::DistanceTo
                                              ((ON_3dPoint *)&a,(ON_3dPoint *)auStack_398);
                        if (local_3c8 <= tr0.minor_radius) {
                          if (tr1tol < local_3c8) {
                            tr1tol = local_3c8;
                          }
                        }
                        else {
                          tr0tol._7_1_ = false;
                          if (tr0tol._6_1_ == false) {
                            onfree(t);
                            this_local._7_1_ = false;
                            goto LAB_0082b937;
                          }
                        }
                      }
                      if (tr0tol._6_1_ != false) {
                        test_point_04.y = P.x;
                        test_point_04.x = (double)auStack_398;
                        test_point_04.z = P.y;
                        ON_Torus::ClosestPointTo(&local_560,(ON_Torus *)auStack_318,test_point_04);
                        T.y = local_560.z;
                        a = local_560.x;
                        T.x = local_560.y;
                        local_3c8 = ON_3dPoint::DistanceTo
                                              ((ON_3dPoint *)&a,(ON_3dPoint *)auStack_398);
                        if (local_3c8 <= tr0.minor_radius) {
                          if (P.z < local_3c8) {
                            P.z = local_3c8;
                          }
                        }
                        else {
                          tr0tol._6_1_ = false;
                          if (tr0tol._7_1_ == false) {
                            onfree(t);
                            this_local._7_1_ = false;
                            goto LAB_0082b937;
                          }
                        }
                      }
                    }
                  }
                }
              }
              onfree(t);
              local_661 = true;
              if (tr0tol._7_1_ == false) {
                local_661 = tr0tol._6_1_;
              }
              this_local._7_1_ = local_661;
              if ((local_661 != false) && (torus != (ON_Torus *)0x0)) {
                if (tr0tol._7_1_ == false) {
                  memcpy(torus,auStack_318,0x90);
                }
                else if (tr0tol._6_1_ == false) {
                  memcpy(torus,&h,0x90);
                }
                else if (P.z < tr1tol) {
                  memcpy(torus,auStack_318,0x90);
                }
                else {
                  memcpy(torus,&h,0x90);
                }
              }
            }
          }
          else {
            this_local._7_1_ = false;
          }
LAB_0082b937:
          ON_Torus::~ON_Torus((ON_Torus *)auStack_318);
          ON_Torus::~ON_Torus((ON_Torus *)&h);
        }
        ON_Arc::~ON_Arc((ON_Arc *)auStack_198);
      }
    }
    ON_Arc::~ON_Arc((ON_Arc *)auStack_d8);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Surface::IsTorus( ON_Torus* torus, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;

  ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
  if ( !crv )
    return false;

  ON_Arc arc0;
  int bIsArc0 = crv->IsArc(0,&arc0,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc0 )
    return false;

  crv = IsoCurve(1,Domain(0).Mid());
  if ( !crv )
    return false;
  ON_Arc arc1;
  int bIsArc1 = crv->IsArc(0,&arc1,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc1 )
    return false;

  double tol = 0.5*ON_SQRT_EPSILON*(arc0.radius+arc1.radius);

  ON_Torus tr0;
  tr0.plane = arc0.plane;
  double h = tr0.plane.plane_equation.ValueAt(arc1.plane.origin);
  tr0.plane.origin = tr0.plane.origin + h*tr0.plane.zaxis;
  tr0.plane.UpdateEquation();
  tr0.major_radius = tr0.plane.origin.DistanceTo(arc1.plane.origin);
  tr0.minor_radius = arc1.radius;

  ON_Torus tr1;
  tr1.plane = arc1.plane;
  h = tr1.plane.plane_equation.ValueAt(arc0.plane.origin);
  tr1.plane.origin = tr1.plane.origin + h*tr1.plane.zaxis;
  tr1.plane.UpdateEquation();
  tr1.major_radius = tr1.plane.origin.DistanceTo(arc0.plane.origin);
  tr1.minor_radius = arc0.radius;

  bool bTestTorus0 = tr0.IsValid()?true:false;
  bool bTestTorus1 = tr1.IsValid()?true:false;
  if ( !bTestTorus0 && !bTestTorus1 )
    return false;
  double tr0tol = 0.0;
  double tr1tol = 0.0;

  ON_3dPoint P, T;
  double a, d;
  for ( a = 0.0; a < 1.0; a += 0.25 )
  {
    P = arc0.PointAt(a*2.0*ON_PI);
    if ( bTestTorus0 )
    {
      T = tr0.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus0 = false;
        if ( !bTestTorus1 )
          return false;
      }
      else if ( d > tr0tol )
        tr0tol = d;
    }
    if ( bTestTorus1 )
    {
      T = tr1.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus1 = false;
        if ( !bTestTorus0 )
          return false;
      }
      else if ( d > tr1tol )
        tr1tol = d;
    }

    P = arc1.PointAt(a*2.0*ON_PI);
    if ( bTestTorus0 )
    {
      T = tr0.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus0 = false;
        if ( !bTestTorus1 )
          return false;
      }
      else if ( d > tr0tol )
        tr0tol = d;
    }
    if ( bTestTorus1 )
    {
      T = tr1.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus1 = false;
        if ( !bTestTorus0 )
          return false;
      }
      else if ( d > tr1tol )
        tr1tol = d;
    }
  }
  // If the arc's planes are perpendicular, then
  // both will be true unless we have a bug or
  // numerical issues.
  if (!bTestTorus0 && !bTestTorus1)
    return false;

  if ( tol < tolerance )
    tol = tolerance;

  double u, v;
  int sc0 = SpanCount(0);
  int sc1 = SpanCount(1);
  double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
  double* t = s + (sc0+1);
  GetSpanVector(0,s);
  GetSpanVector(1,t);
  for ( int i = 0; i < sc0; i++ )
  {
    for ( int ii = i?1:0; ii <= 4; ii++ )
    {
      u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
      for ( int j = 0; j < sc1; j++ )
      {
        for ( int jj = j?1:0; jj <= 4; jj++ )
        {
          v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
          P = PointAt(u,v);
          if ( bTestTorus0 )
          {
            T = tr0.ClosestPointTo(P);
            d = T.DistanceTo(P);
            if ( d > tol )
            {
              bTestTorus0 = false;
              if ( !bTestTorus1 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > tr0tol )
              tr0tol = d;
          }
          if ( bTestTorus1 )
          {
            T = tr1.ClosestPointTo(P);
            d = T.DistanceTo(P);
            if ( d > tol )
            {
              bTestTorus1 = false;
              if ( !bTestTorus0 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > tr1tol )
              tr1tol = d;
          }
        }
      }
    }
  }
  onfree(s);

  bool rc = (bTestTorus0 || bTestTorus1);
  if ( rc && torus )
  {
    if (!bTestTorus0)
      *torus = tr1;
    else if (!bTestTorus1)
      *torus = tr0;
    else if (tr0tol <= tr1tol)
      *torus = tr0;
    else
      *torus = tr1;
  }

  return rc;
}